

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->pendingFuntors_,cb);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  bVar1 = isInLoopThread(this);
  if ((bVar1) && (this->callingPendingFunctors_ != true)) {
    return;
  }
  wakeup(this);
  return;
}

Assistant:

void EventLoop::queueInLoop(Functor cb) {
    {
        MutexLockGuard lock(mutex_);
        pendingFuntors_.push_back(std::move(cb));
    }
    if(!isInLoopThread() || callingPendingFunctors_) {
        wakeup();
    }
}